

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
::write_decimal<unsigned_long_long>
          (basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
           *this,unsigned_long_long value)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  char_type buffer [26];
  ostream_iterator<char,_char,_std::char_traits<char>_> local_58;
  char local_48 [40];
  
  lVar2 = 0x3f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  uVar6 = ((uint)lVar2 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  uVar6 = (uVar6 - (value < (ulong)(&internal::basic_data<void>::ZERO_OR_POWERS_OF_10_64)[uVar6])) +
          1;
  uVar7 = (ulong)uVar6;
  pcVar3 = local_48 + uVar7;
  uVar5 = value;
  if (99 < value) {
    do {
      value = uVar5 / 100;
      *(undefined2 *)(pcVar3 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uint)((int)uVar5 + (int)value * -100) * 2)
      ;
      pcVar3 = pcVar3 + -2;
      bVar1 = 9999 < uVar5;
      uVar5 = value;
    } while (bVar1);
  }
  local_58._M_stream = (this->out_)._M_stream;
  local_58._M_string = (this->out_)._M_string;
  if (value < 10) {
    bVar4 = (byte)value | 0x30;
    lVar2 = -1;
  }
  else {
    pcVar3[-1] = internal::basic_data<void>::DIGITS[(value * 2 & 0xffffffff) + 1];
    bVar4 = internal::basic_data<void>::DIGITS[value * 2 & 0x1fffffffe];
    lVar2 = -2;
  }
  pcVar3[lVar2] = bVar4;
  if (0 < (int)uVar6) {
    pcVar3 = local_48;
    do {
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_58,pcVar3);
      pcVar3 = pcVar3 + 1;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  (this->out_)._M_stream = local_58._M_stream;
  (this->out_)._M_string = local_58._M_string;
  return;
}

Assistant:

inline int count_digits(uint64_t n) {
  // Based on http://graphics.stanford.edu/~seander/bithacks.html#IntegerLog10
  // and the benchmark https://github.com/localvoid/cxx-benchmark-count-digits.
  int t = (64 - FMT_BUILTIN_CLZLL(n | 1)) * 1233 >> 12;
  return t - (n < data::ZERO_OR_POWERS_OF_10_64[t]) + 1;
}